

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_SetInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClassActor *type;
  int iVar1;
  uint uVar2;
  VMValue *pVVar3;
  AActor *pAVar4;
  AInventory *pAVar5;
  bool bVar6;
  int local_a4;
  bool local_9e;
  bool local_9b;
  int u_9;
  int u_8;
  int u_7;
  int u_6;
  int u_5;
  int u_4;
  int amt;
  int u_3;
  int u_2;
  AInventory *item;
  int u_1;
  AActor *mobj;
  int u;
  bool res;
  bool beyondMax;
  int ptr;
  int amount;
  MetaClass *itemtype;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x9b3,
                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar6 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar6 = true, (param->field_0).field_1.atag != 1)) {
    bVar6 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar6) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x9b3,
                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar4 = (AActor *)(param->field_0).field_1.a;
  local_9b = true;
  if (pAVar4 != (AActor *)0x0) {
    local_9b = DObject::IsKindOf((DObject *)pAVar4,AActor::RegistrationInfo.MyClass);
  }
  if (local_9b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x9b3,
                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x9b4,
                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar6 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar6 = true, param[1].field_0.field_1.atag != 1)) {
    bVar6 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar6) {
    type = (PClassActor *)param[1].field_0.field_1.a;
    local_9e = true;
    if (type != (PClassActor *)0x0) {
      local_9e = PClass::IsDescendantOf((PClass *)type,AInventory::RegistrationInfo.MyClass);
    }
    if (local_9e == false) {
      __assert_fail("itemtype == NULL || itemtype->IsDescendantOf(RUNTIME_CLASS(AInventory))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x9b4,
                    "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x9b5,
                    "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[2].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x9b5,
                    "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_a4 = param[2].field_0.i;
    if (numparam < 4) {
      pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      if ((pVVar3->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x9b6,
                      "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      u = (pVVar3->field_0).i;
    }
    else {
      if (param[3].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x9b6,
                      "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      u = param[3].field_0.i;
    }
    if (numparam < 5) {
      pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      if ((pVVar3->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x9b7,
                      "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      iVar1 = (pVVar3->field_0).i;
    }
    else {
      if (param[4].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x9b7,
                      "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar1 = param[4].field_0.i;
    }
    if (type == (PClassActor *)0x0) {
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x9bd,
                        "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,0);
        param_local._4_4_ = 1;
      }
    }
    else {
      pAVar4 = COPY_AAPTR(pAVar4,u);
      if (pAVar4 == (AActor *)0x0) {
        if (numret < 1) {
          param_local._4_4_ = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x9c4,
                          "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetInt(ret,0);
          param_local._4_4_ = 1;
        }
      }
      else {
        pAVar5 = AActor::FindInventory(pAVar4,type,false);
        if (pAVar5 == (AInventory *)0x0) {
          if (local_a4 < 1) {
            if (numret < 1) {
              param_local._4_4_ = 0;
            }
            else {
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x9e9,
                              "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              VMReturn::SetInt(ret,0);
              param_local._4_4_ = 1;
            }
          }
          else {
            pAVar5 = (AInventory *)Spawn(type);
            if (pAVar5 == (AInventory *)0x0) {
              if (numret < 1) {
                param_local._4_4_ = 0;
              }
              else {
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x9ee,
                                "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                VMReturn::SetInt(ret,0);
                param_local._4_4_ = 1;
              }
            }
            else {
              pAVar5->Amount = local_a4;
              TFlags<ActorFlag,_unsigned_int>::operator|=(&(pAVar5->super_AActor).flags,MF_DROPPED);
              pAVar5->ItemFlags = pAVar5->ItemFlags | 0x4000;
              AActor::ClearCounters((AActor *)pAVar5);
              bVar6 = AInventory::CallTryPickup(pAVar5,pAVar4,(AActor **)0x0);
              if (bVar6) {
                if (numret < 1) {
                  param_local._4_4_ = 0;
                }
                else {
                  if (ret == (VMReturn *)0x0) {
                    __assert_fail("ret != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                  ,0x9fb,
                                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                 );
                  }
                  VMReturn::SetInt(ret,1);
                  param_local._4_4_ = 1;
                }
              }
              else {
                (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
                if (numret < 1) {
                  param_local._4_4_ = 0;
                }
                else {
                  if (ret == (VMReturn *)0x0) {
                    __assert_fail("ret != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                  ,0x9f9,
                                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                 );
                  }
                  VMReturn::SetInt(ret,0);
                  param_local._4_4_ = 1;
                }
              }
            }
          }
        }
        else if (local_a4 == pAVar5->Amount) {
          if (numret < 1) {
            param_local._4_4_ = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9d1,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            VMReturn::SetInt(ret,0);
            param_local._4_4_ = 1;
          }
        }
        else if (local_a4 < 1) {
          iVar1 = (*(pAVar4->super_DThinker).super_DObject._vptr_DObject[0x16])
                            (pAVar4,type,(ulong)(uint)pAVar5->Amount,1,0);
          if (numret < 1) {
            param_local._4_4_ = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9d7,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            VMReturn::SetInt(ret,(uint)((byte)iVar1 & 1));
            param_local._4_4_ = 1;
          }
        }
        else if (local_a4 < pAVar5->Amount) {
          uVar2 = pAVar5->Amount - local_a4;
          if ((int)uVar2 < 1) {
            uVar2 = -uVar2;
          }
          iVar1 = (*(pAVar4->super_DThinker).super_DObject._vptr_DObject[0x16])
                            (pAVar4,type,(ulong)uVar2,1,0);
          if (numret < 1) {
            param_local._4_4_ = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9dd,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            VMReturn::SetInt(ret,(uint)((byte)iVar1 & 1));
            param_local._4_4_ = 1;
          }
        }
        else {
          if (iVar1 == 0) {
            local_a4 = clamp<int>(local_a4,0,pAVar5->MaxAmount);
          }
          pAVar5->Amount = local_a4;
          if (numret < 1) {
            param_local._4_4_ = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9e2,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            VMReturn::SetInt(ret,1);
            param_local._4_4_ = 1;
          }
        }
      }
    }
    return param_local._4_4_;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x9b4,
                "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(itemtype, AInventory);
	PARAM_INT(amount);
	PARAM_INT_DEF(ptr);
	PARAM_BOOL_DEF(beyondMax);

	bool res = false;

	if (itemtype == nullptr)
	{
		ACTION_RETURN_BOOL(false);
	}

	AActor *mobj = COPY_AAPTR(self, ptr);

	if (mobj == nullptr)
	{
		ACTION_RETURN_BOOL(false);
	}

	AInventory *item = mobj->FindInventory(itemtype);

	if (item != nullptr)
	{
		// A_SetInventory sets the absolute amount. 
		// Subtract or set the appropriate amount as necessary.

		if (amount == item->Amount)
		{
			// Nothing was changed.
			ACTION_RETURN_BOOL(false);
		}
		else if (amount <= 0)
		{
			//Remove it all.
			res = (mobj->TakeInventory(itemtype, item->Amount, true, false));
			ACTION_RETURN_BOOL(res);
		}
		else if (amount < item->Amount)
		{
			int amt = abs(item->Amount - amount);
			res = (mobj->TakeInventory(itemtype, amt, true, false));
			ACTION_RETURN_BOOL(res);
		}
		else
		{
			item->Amount = (beyondMax ? amount : clamp(amount, 0, item->MaxAmount));
			ACTION_RETURN_BOOL(true);
		}
	}
	else
	{
		if (amount <= 0)
		{
			ACTION_RETURN_BOOL(false);
		}
		item = static_cast<AInventory *>(Spawn(itemtype));
		if (item == nullptr)
		{
			ACTION_RETURN_BOOL(false);
		}
		else
		{
			item->Amount = amount;
			item->flags |= MF_DROPPED;
			item->ItemFlags |= IF_IGNORESKILL;
			item->ClearCounters();
			if (!item->CallTryPickup(mobj))
			{
				item->Destroy();
				ACTION_RETURN_BOOL(false);
			}
			ACTION_RETURN_BOOL(true);
		}
	}
	ACTION_RETURN_BOOL(false);
}